

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# erarules.cpp
# Opt level: O0

void __thiscall
icu_63::EraRules::getStartDate
          (EraRules *this,int32_t eraIdx,int32_t (*fields) [3],UErrorCode *status)

{
  UBool UVar1;
  int *piVar2;
  UErrorCode *status_local;
  int32_t (*fields_local) [3];
  int32_t eraIdx_local;
  EraRules *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if ((eraIdx < 0) || (this->numEras <= eraIdx)) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      piVar2 = LocalMemory<int>::operator[](&this->startDates,(long)eraIdx);
      decodeDate(*piVar2,fields);
    }
  }
  return;
}

Assistant:

void EraRules::getStartDate(int32_t eraIdx, int32_t (&fields)[3], UErrorCode& status) const {
    if(U_FAILURE(status)) {
        return;
    }
    if (eraIdx < 0 || eraIdx >= numEras) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    decodeDate(startDates[eraIdx], fields);
}